

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O3

void brotli::StoreBlockSwitch
               (BlockSplitCode *code,size_t block_ix,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (block_ix != 0) {
    uVar3 = (code->type_code).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[block_ix];
    bVar1 = (code->type_depths).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar3];
    uVar2 = (code->type_bits).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar3];
    if (uVar2 >> (bVar1 & 0x3f) != 0) goto LAB_00177dbb;
    if (0x38 < bVar1) goto LAB_00177dda;
    uVar5 = *storage_ix;
    *(ulong *)(storage + (uVar5 >> 3)) =
         (ulong)uVar2 << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
    *storage_ix = bVar1 + uVar5;
  }
  uVar3 = (code->length_prefix).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[block_ix];
  bVar1 = (code->length_depths).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar3];
  uVar2 = (code->length_bits).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar3];
  if (uVar2 >> (bVar1 & 0x3f) == 0) {
    if (bVar1 < 0x39) {
      uVar5 = *storage_ix;
      uVar6 = bVar1 + uVar5;
      *(ulong *)(storage + (uVar5 >> 3)) =
           (ulong)uVar2 << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
      *storage_ix = uVar6;
      uVar3 = (code->length_nextra).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[block_ix];
      uVar4 = (code->length_extra).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[block_ix];
      if (uVar4 >> ((byte)uVar3 & 0x3f) != 0) goto LAB_00177dbb;
      if (uVar3 < 0x39) {
        *(ulong *)(storage + (uVar6 >> 3)) =
             (ulong)uVar4 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
        *storage_ix = uVar3 + uVar6;
        return;
      }
    }
LAB_00177dda:
    __assert_fail("n_bits <= 56",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                  ,0x2d,
                  "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                 );
  }
LAB_00177dbb:
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                ,0x2c,
                "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)")
  ;
}

Assistant:

void StoreBlockSwitch(const BlockSplitCode& code,
                      const size_t block_ix,
                      size_t* storage_ix,
                      uint8_t* storage) {
  if (block_ix > 0) {
    size_t typecode = code.type_code[block_ix];
    WriteBits(code.type_depths[typecode], code.type_bits[typecode],
              storage_ix, storage);
  }
  size_t lencode = code.length_prefix[block_ix];
  WriteBits(code.length_depths[lencode], code.length_bits[lencode],
            storage_ix, storage);
  WriteBits(code.length_nextra[block_ix], code.length_extra[block_ix],
            storage_ix, storage);
}